

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64.c
# Opt level: O1

void BYTE_OUT1IR(dill_stream s,int rex,int insn1,int imm32)

{
  byte *pbVar1;
  long lVar2;
  int tmp;
  
  if (s->p->code_limit <= s->p->cur_ip) {
    extend_dill_stream(s);
  }
  pbVar1 = (byte *)s->p->cur_ip;
  if (rex == 0) {
    *pbVar1 = (byte)insn1;
    lVar2 = 1;
  }
  else {
    *pbVar1 = (byte)rex | 0x40;
    pbVar1[1] = (byte)insn1;
    lVar2 = 2;
  }
  *(int *)(pbVar1 + lVar2) = imm32;
  if (s->dill_debug != 0) {
    dump_cur_dill_insn(s);
  }
  s->p->cur_ip = s->p->cur_ip + (6 - (ulong)(rex == 0));
  return;
}

Assistant:

static void
BYTE_OUT1IR(dill_stream s, int rex, int insn1, int imm32)
{
    unsigned char* tmp_ip;
    if (s->p->cur_ip >= s->p->code_limit) {
        extend_dill_stream(s);
    }
    tmp_ip = (unsigned char*)s->p->cur_ip;
    if (rex != 0) {
        int tmp = imm32;
        *tmp_ip = (unsigned char)rex | 0x40;
        *(tmp_ip + 1) = (unsigned char)insn1;
        memcpy(tmp_ip + 2, &tmp, 4);
    } else {
        int tmp = imm32;
        *(tmp_ip) = (unsigned char)insn1;
        memcpy(tmp_ip + 1, &tmp, 4);
    }
    if (s->dill_debug)
        dump_cur_dill_insn(s);
    s->p->cur_ip = ((char*)s->p->cur_ip) + 5;
    if (rex != 0)
        s->p->cur_ip++;
}